

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::UninstallProbe(FunctionBody *this,int offset)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  uint uVar4;
  ByteBlock *pBVar5;
  byte *pbVar6;
  byte *pbVar7;
  undefined4 *puVar8;
  OpCode originalOpCode;
  byte *pbyteCodeBlockBuffer;
  int offset_local;
  FunctionBody *this_local;
  
  if (-1 < offset) {
    pBVar5 = Memory::WriteBarrierPtr<Js::ByteBlock>::operator->(&this->byteCodeBlock);
    uVar4 = ByteBlock::GetLength(pBVar5);
    if (offset + 1U < uVar4) {
      pBVar5 = Memory::WriteBarrierPtr<Js::ByteBlock>::operator->(&this->byteCodeBlock);
      pbVar6 = ByteBlock::GetBuffer(pBVar5);
      pBVar5 = GetProbeBackingBlock(this);
      pbVar7 = ByteBlock::GetBuffer(pBVar5);
      OVar3 = ByteCodeReader::PeekByteOp(pbVar7 + offset);
      pbVar6[offset] = (byte)OVar3;
      (this->m_sourceInfo).m_probeCount = (this->m_sourceInfo).m_probeCount + -1;
      if ((this->m_sourceInfo).m_probeCount < 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x102c,"(m_sourceInfo.m_probeCount >= 0)",
                                    "Probe (Break Point) count became negative!");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool FunctionBody::UninstallProbe(int offset)
    {
        if (offset < 0 || ((uint)offset + 1) >= byteCodeBlock->GetLength())
        {
            return false;
        }
        byte* pbyteCodeBlockBuffer = byteCodeBlock->GetBuffer();

        Js::OpCode originalOpCode = ByteCodeReader::PeekByteOp(GetProbeBackingBlock()->GetBuffer() + offset);
        *(pbyteCodeBlockBuffer + offset) = (byte)originalOpCode;

        --m_sourceInfo.m_probeCount;
        AssertMsg(m_sourceInfo.m_probeCount >= 0, "Probe (Break Point) count became negative!");

        return true;
    }